

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.h
# Opt level: O2

float RVO::distSqPointLineSegment(Vector2 *a,Vector2 *b,Vector2 *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = a->x_;
  fVar2 = a->y_;
  fVar3 = b->x_;
  fVar6 = b->y_;
  fVar4 = c->x_ - fVar1;
  fVar5 = fVar3 - fVar1;
  fVar7 = c->y_ - fVar2;
  fVar8 = fVar6 - fVar2;
  fVar9 = (fVar5 * fVar4 + fVar8 * fVar7) / (fVar5 * fVar5 + fVar8 * fVar8);
  if (0.0 <= fVar9) {
    if (fVar9 <= 1.0) {
      fVar3 = fVar1 + fVar5 * fVar9;
      fVar6 = fVar2 + fVar8 * fVar9;
    }
    fVar6 = c->y_ - fVar6;
    fVar3 = c->x_ - fVar3;
    return fVar3 * fVar3 + fVar6 * fVar6;
  }
  return fVar4 * fVar4 + fVar7 * fVar7;
}

Assistant:

inline Vector2 operator-(const Vector2 &vector) const
		{
			return Vector2(x_ - vector.x(), y_ - vector.y());
		}